

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_outfile_t mcpl_create_outfile(char *filename)

{
  int iVar1;
  char *mode;
  mcpl_outfile_t of;
  long *plVar2;
  char *pcVar3;
  FILE *pFVar4;
  char *in_RDI;
  mcpl_outfileinternal_t *f;
  char *lastdot;
  size_t n;
  mcpl_outfile_t out;
  
  if (in_RDI == (char *)0x0) {
    mcpl_error((char *)0x1019dd);
  }
  mode = (char *)strlen(in_RDI);
  if (mode == (char *)0x0) {
    mcpl_error((char *)0x101a00);
  }
  if ((char *)0x1000 < mode) {
    mcpl_error((char *)0x101a17);
  }
  of.internal = strrchr(in_RDI,0x2e);
  if (((char *)of.internal == in_RDI) && (mode == (char *)0x5)) {
    mcpl_error((char *)0x101a4b);
  }
  mcpl_platform_compatibility_check();
  plVar2 = (long *)mcpl_internal_calloc((size_t)f,0);
  if ((char *)of.internal != (char *)0x0) {
    iVar1 = strcmp((char *)of.internal,".mcpl");
    if (iVar1 == 0) {
      pcVar3 = mcpl_internal_malloc((size_t)of.internal);
      *plVar2 = (long)pcVar3;
      memcpy((void *)*plVar2,in_RDI,(size_t)(mode + 1));
      goto LAB_00101b0d;
    }
  }
  pcVar3 = mcpl_internal_malloc((size_t)of.internal);
  *plVar2 = (long)pcVar3;
  memcpy((void *)*plVar2,in_RDI,(size_t)mode);
  builtin_strncpy(mode + *plVar2,".mcpl",6);
LAB_00101b0d:
  plVar2[2] = 0;
  *(undefined4 *)(plVar2 + 3) = 0;
  plVar2[4] = 0;
  *(undefined4 *)(plVar2 + 5) = 0;
  plVar2[6] = 0;
  plVar2[7] = 0;
  plVar2[8] = 0;
  *(undefined4 *)(plVar2 + 9) = 0;
  *(undefined4 *)((long)plVar2 + 0x4c) = 0;
  *(undefined4 *)(plVar2 + 10) = 1;
  *(undefined4 *)((long)plVar2 + 0x54) = 0;
  plVar2[0xb] = 0;
  *(undefined4 *)(plVar2 + 0xc) = 1;
  plVar2[0xd] = 0;
  pFVar4 = mcpl_internal_fopen(in_RDI,mode);
  plVar2[1] = (long)pFVar4;
  if (plVar2[1] == 0) {
    mcpl_internal_cleanup_outfile((mcpl_outfileinternal_t *)0x101be0);
    mcpl_error((char *)0x101bec);
  }
  mcpl_recalc_psize(of);
  return (mcpl_outfile_t)plVar2;
}

Assistant:

mcpl_outfile_t mcpl_create_outfile(const char * filename)
{
  //Sanity check chosen filename and append ".mcpl" if missing to help people
  //who forgot to add the extension (in the hope of higher consistency).
  if (!filename)
    mcpl_error("mcpl_create_outfile called with null string.");
  size_t n = strlen(filename);
  if (!n)
    mcpl_error("mcpl_create_outfile called with empty string.");
  if (n>4096)
    mcpl_error("mcpl_create_outfile called with too long string.");
  const char * lastdot = strrchr(filename, '.');
  if (lastdot==filename && n==5)
    mcpl_error("mcpl_create_outfile called with string with no basename part (\".mcpl\").");

  //Initialise data structures and open file:
  mcpl_platform_compatibility_check();

  mcpl_outfile_t out;
  out.internal = NULL;

  mcpl_outfileinternal_t * f
    = (mcpl_outfileinternal_t*)mcpl_internal_calloc( 1, sizeof(mcpl_outfileinternal_t) );

  if (!lastdot || strcmp(lastdot, ".mcpl") != 0) {
    f->filename = mcpl_internal_malloc(n+6);
    memcpy(f->filename,filename,n);
    memcpy(f->filename+n,".mcpl",6);
  } else {
    f->filename = mcpl_internal_malloc(n+1);
    memcpy(f->filename,filename,n+1);
  }

  f->hdr_srcprogname = NULL;
  f->ncomments = 0;
  f->comments = NULL;
  f->nblobs = 0;
  f->blobkeys = NULL;
  f->bloblengths = NULL;
  f->blobs = NULL;
  f->opt_userflags = 0;
  f->opt_polarisation = 0;
  f->opt_singleprec = 1;
  f->opt_universalpdgcode = 0;
  f->opt_universalweight = 0.0;
  f->header_notwritten = 1;
  f->nparticles = 0;
  f->file = mcpl_internal_fopen(f->filename,"wb");
  if (!f->file) {
    mcpl_internal_cleanup_outfile(f);
    mcpl_error("Unable to open output file!");
  }
  out.internal = f;
  mcpl_recalc_psize(out);
  return out;
}